

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O0

bool ConvertBits<6,8,false,DecodeBase64(std::basic_string_view<char,std::char_traits<char>>)::__0,char_const*,DecodeBase64(std::basic_string_view<char,std::char_traits<char>>)::__1>
               (undefined8 param_1,long param_2,long param_3)

{
  long lVar1;
  int8_t iVar2;
  long in_FS_OFFSET;
  int v;
  size_t max_acc;
  size_t maxv;
  size_t bits;
  size_t acc;
  undefined7 in_stack_ffffffffffffffa8;
  uchar in_stack_ffffffffffffffaf;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_20;
  undefined1 local_12;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = 0;
  local_38 = 0;
  local_20 = param_2;
  do {
    if (local_20 == param_3) {
      if ((local_38 < 6) && ((local_30 << (8U - (char)local_38 & 0x3f) & 0xff) == 0)) {
        local_12 = true;
      }
      else {
        local_12 = false;
      }
LAB_01ac6a26:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_12;
      }
      __stack_chk_fail();
    }
    iVar2 = DecodeBase64::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),'\0');
    if (iVar2 < 0) {
      local_12 = false;
      goto LAB_01ac6a26;
    }
    local_30 = (local_30 << 6 | (long)(int)iVar2) & 0x1fff;
    local_38 = local_38 + 6;
    while (7 < local_38) {
      local_38 = local_38 - 8;
      DecodeBase64::anon_class_8_1_ba1d7401::operator()
                ((anon_class_8_1_ba1d7401 *)0x1ac69df,in_stack_ffffffffffffffaf);
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool ConvertBits(O outfn, It it, It end, I infn = {}) {
    size_t acc = 0;
    size_t bits = 0;
    constexpr size_t maxv = (1 << tobits) - 1;
    constexpr size_t max_acc = (1 << (frombits + tobits - 1)) - 1;
    while (it != end) {
        int v = infn(*it);
        if (v < 0) return false;
        acc = ((acc << frombits) | v) & max_acc;
        bits += frombits;
        while (bits >= tobits) {
            bits -= tobits;
            outfn((acc >> bits) & maxv);
        }
        ++it;
    }
    if (pad) {
        if (bits) outfn((acc << (tobits - bits)) & maxv);
    } else if (bits >= frombits || ((acc << (tobits - bits)) & maxv)) {
        return false;
    }
    return true;
}